

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

StringToDoubleMap * __thiscall
CoreML::Specification::Imputer::mutable_imputedstringdictionary(Imputer *this)

{
  bool bVar1;
  StringToDoubleMap *this_00;
  Imputer *this_local;
  
  bVar1 = has_imputedstringdictionary(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputedstringdictionary(this);
    this_00 = (StringToDoubleMap *)operator_new(0x38);
    StringToDoubleMap::StringToDoubleMap(this_00);
    (this->ImputedValue_).imputedstringdictionary_ = this_00;
  }
  return (StringToDoubleMap *)(this->ImputedValue_).imputeddoublevalue_;
}

Assistant:

inline ::CoreML::Specification::StringToDoubleMap* Imputer::mutable_imputedstringdictionary() {
  if (!has_imputedstringdictionary()) {
    clear_ImputedValue();
    set_has_imputedstringdictionary();
    ImputedValue_.imputedstringdictionary_ = new ::CoreML::Specification::StringToDoubleMap;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedStringDictionary)
  return ImputedValue_.imputedstringdictionary_;
}